

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcParser::create_sym_node(CTcParser *this,textchar_t *sym,size_t sym_len)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  CTcParser *in_RDI;
  tcprsdbg_sym_info info;
  CTcSymbol *entry;
  CTcPrsSymtab *symtab;
  tcprsdbg_sym_info *in_stack_ffffffffffffff88;
  CTPNSymDebugLocal *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  CTcPrsSymtab *in_stack_ffffffffffffffa0;
  undefined1 local_4c [28];
  CTcSymbol *local_30;
  CTcPrsSymtab *local_28;
  undefined8 local_20;
  undefined8 local_18;
  CTcPrsNode *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = CTcPrsSymtab::find(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                (size_t)in_stack_ffffffffffffff90,
                                (CTcPrsSymtab **)in_stack_ffffffffffffff88);
  if ((local_30 == (CTcSymbol *)0x0) || (local_28 == in_RDI->global_symtab_)) {
    if ((in_RDI->debug_symtab_ == (CTcPrsDbgSymtab *)0x0) ||
       (iVar1 = (*(code *)**(undefined8 **)in_RDI->debug_symtab_)
                          (in_RDI->debug_symtab_,local_18,local_20,local_4c), iVar1 == 0)) {
      set_self_referenced(in_RDI,1);
      pCVar2 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2a3018);
      CTPNSym::CTPNSym((CTPNSym *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(size_t)pCVar2
                      );
      local_8 = pCVar2;
    }
    else {
      pCVar2 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2a2fb8);
      CTPNSymDebugLocal::CTPNSymDebugLocal(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_8 = pCVar2;
    }
  }
  else {
    pCVar2 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2a2f32);
    CTPNSymResolved::CTPNSymResolved
              ((CTPNSymResolved *)in_stack_ffffffffffffff90,(CTcSymbol *)in_stack_ffffffffffffff88);
    local_8 = pCVar2;
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcParser::create_sym_node(const textchar_t *sym, size_t sym_len)
{
    /* 
     *   First, look up the symbol in local scope.  Local scope symbols
     *   can always be resolved during parsing, because the language
     *   requires that local scope items be declared before their first
     *   use. 
     */
    CTcPrsSymtab *symtab;
    CTcSymbol *entry = local_symtab_->find(sym, sym_len, &symtab);

    /* if we found it in local scope, return a resolved symbol node */
    if (entry != 0 && symtab != global_symtab_)
        return new CTPNSymResolved(entry);

    /* if there's a debugger local scope, look it up there */
    if (debug_symtab_ != 0)
    {
        /* look it up in the debug symbol table */
        tcprsdbg_sym_info info;
        if (debug_symtab_->find_symbol(sym, sym_len, &info))
        {
            /* found it - return a debugger local variable */
            return new CTPNSymDebugLocal(&info);
        }
    }

    /* 
     *   We didn't find it in local scope, so the symbol cannot be resolved
     *   until code generation - return an unresolved symbol node.  Note a
     *   possible implicit self-reference, since this could be a property of
     *   'self'.  
     */
    set_self_referenced(TRUE);
    return new CTPNSym(sym, sym_len);
}